

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O1

int callBackInstallAutoCompletion(int index,char **buff)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  long *plVar7;
  size_type *psVar8;
  string programName;
  string script;
  string location;
  fstream fileWirter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [32];
  
  std::__cxx11::string::string((string *)&local_300,*buff,(allocator *)local_240);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"generate auto completion",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  while( true ) {
    iVar4 = std::__cxx11::string::find((char *)&local_300,0x10c547,0);
    if (iVar4 == -1) break;
    std::__cxx11::string::erase((ulong)&local_300,0);
  }
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_300._M_dataplus._M_p,
             local_300._M_dataplus._M_p + local_300._M_string_length);
  std::__cxx11::string::append((char *)&local_2a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                 &autoCompletionScript_abi_cxx11_,&local_300);
  plVar5 = (long *)std::__cxx11::string::append(local_240);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_2d0 = *plVar7;
    lStack_2c8 = plVar5[3];
    local_2e0 = &local_2d0;
  }
  else {
    local_2d0 = *plVar7;
    local_2e0 = (long *)*plVar5;
  }
  local_2d8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar2 = local_240 + 0x10;
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_);
  }
  std::operator+(&local_320,"complete -F _function ./",&local_300);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_320);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_230[0]._0_8_ = *psVar8;
    local_230[0]._8_8_ = plVar5[3];
    local_240._0_8_ = pcVar2;
  }
  else {
    local_230[0]._0_8_ = *psVar8;
    local_240._0_8_ = (size_type *)*plVar5;
  }
  local_240._8_8_ = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_2e0,local_240._0_8_);
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_);
  }
  paVar1 = &local_320.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  std::fstream::fstream(local_240);
  std::fstream::open((string *)local_240,(_Ios_Openmode)&local_2a0);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::operator+(&local_320,"failed to open ",&local_2a0);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_320._M_dataplus._M_p,local_320._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar1) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    std::fstream::~fstream(local_240);
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    return index;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_240 + 0x10),(char *)local_2e0,local_2d8);
  std::fstream::close();
  std::operator+(&local_2c0,"try it out with: \n\t \"source ",&local_300);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_320._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_320._M_dataplus._M_p == psVar8) {
    local_320.field_2._M_allocated_capacity = *psVar8;
    local_320.field_2._8_8_ = plVar5[3];
    local_320._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar8;
  }
  local_320._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_320._M_dataplus._M_p,local_320._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  std::operator+(&local_260,
                 "to persist the atuo completion by copying the .bash file to /etc/bash_completion.d/ with:  \n\t \"cp "
                 ,&local_300);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_280._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_280._M_dataplus._M_p == psVar8) {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280.field_2._8_8_ = plVar5[3];
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar8;
  }
  local_280._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::operator+(&local_2c0,&local_280,&local_300);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_320._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_320._M_dataplus._M_p == psVar8) {
    local_320.field_2._M_allocated_capacity = *psVar8;
    local_320.field_2._8_8_ = plVar5[3];
    local_320._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar8;
  }
  local_320._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_320._M_dataplus._M_p,local_320._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  exit(0);
}

Assistant:

int callBackInstallAutoCompletion(int index, char **buff) {
#ifdef __linux__
    string programName = string(buff[0]);
    cout << "generate auto completion" << endl;
    int i = 0;
    // extract Binary name
    while ((i = programName.find("/")) != string::npos) {
        programName.erase(0, i + 1);
    }
    string location = programName + ".bash";
    string script = autoCompletionScript + programName + " \n";
    script += "complete -F _function ./" + programName + " \n";
    fstream fileWirter;
    fileWirter.open(location, fstream::out | ios::trunc);
    if (!fileWirter.is_open()) {
        cout << "failed to open " + location << endl;
        return index;
    }
    fileWirter << script;
    fileWirter.close();

    cout << "try it out with: \n\t \"source " + programName + ".bash\"" << endl;
    cout << "to persist the atuo completion by copying the .bash file to /etc/bash_completion.d/ with:  \n\t \"cp "
            "" + programName + ".bash  /etc/bash_completion.d/" + programName + ".bash\" " << endl;

    exit(0);
#elif __WIN32
    cout << "Auto completion not (jet) suportet under Windows"<<endl;
#endif
    return index;
}